

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snprintf_support.c
# Opt level: O0

uint check_integer_format(char format)

{
  uint retValue;
  char format_local;
  
  retValue = 0;
  if (((int)format - 99U < 2) || (format == 0x68)) {
    retValue = 1;
  }
  return retValue;
}

Assistant:

unsigned int
check_integer_format(const char format)
{
	unsigned int  retValue = 0; // default failure
	switch( format) {
		case FMT_CHAR  :
		case FMT_SHORT :
		case FMT_INT   :
			retValue = 1;
			break;
	}
	return retValue;
}